

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.cpp
# Opt level: O3

HaF32 HACD::fm_computeMeshVolume(HaF32 *vertices,size_t tcount,HaU32 *indices)

{
  HaU32 *pHVar1;
  HaU32 *pHVar2;
  HaU32 HVar3;
  float fVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  
  auVar11 = ZEXT816(0) << 0x40;
  auVar12 = ZEXT1664(auVar11);
  if (tcount != 0) {
    uVar5 = 1;
    do {
      pHVar1 = indices + 1;
      pHVar2 = indices + 2;
      HVar3 = *indices;
      indices = indices + 3;
      uVar8 = (ulong)(*pHVar1 * 3);
      uVar9 = (ulong)(*pHVar2 * 3);
      uVar6 = (ulong)(HVar3 * 3);
      uVar7 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)((float)vertices[uVar9 + 1] * (float)vertices[uVar8] *
                                              (float)vertices[uVar6 + 2])),
                                ZEXT416((uint)vertices[uVar9 + 2]),
                                ZEXT416((uint)((float)vertices[uVar6] * (float)vertices[uVar8 + 1]))
                               );
      auVar11 = vfmadd213ss_fma(ZEXT416((uint)((float)vertices[uVar9] * (float)vertices[uVar6 + 1]))
                                ,ZEXT416((uint)vertices[uVar8 + 2]),auVar11);
      auVar11 = vfnmadd213ss_fma(ZEXT416((uint)((float)vertices[uVar9 + 1] * (float)vertices[uVar6])
                                        ),ZEXT416((uint)vertices[uVar8 + 2]),auVar11);
      auVar11 = vfnmadd213ss_fma(ZEXT416((uint)((float)vertices[uVar6 + 1] * (float)vertices[uVar8])
                                        ),ZEXT416((uint)vertices[uVar9 + 2]),auVar11);
      auVar11 = vfnmadd213ss_fma(ZEXT416((uint)((float)vertices[uVar8 + 1] * (float)vertices[uVar9])
                                        ),ZEXT416((uint)vertices[uVar6 + 2]),auVar11);
      fVar4 = auVar12._0_4_ + auVar11._0_4_;
      auVar12 = ZEXT464((uint)fVar4);
    } while (uVar7 < tcount);
    auVar11 = ZEXT416((uint)(fVar4 * 0.16666667));
  }
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar10 = vxorps_avx512vl(auVar11,auVar10);
  auVar11 = vmaxss_avx(auVar10,auVar11);
  return auVar11._0_4_;
}

Assistant:

hacd::HaF32  fm_computeMeshVolume(const hacd::HaF32 *vertices,size_t tcount,const hacd::HaU32 *indices)
	{
		hacd::HaF32 volume = 0;

		for (hacd::HaU32 i=0; i<tcount; i++,indices+=3)
		{
			const hacd::HaF32 *p1 = &vertices[ indices[0]*3 ];
			const hacd::HaF32 *p2 = &vertices[ indices[1]*3 ];
			const hacd::HaF32 *p3 = &vertices[ indices[2]*3 ];
			volume+=det(p1,p2,p3); // compute the volume of the tetrahedran relative to the origin.
		}

		volume*=(1.0f/6.0f);
		if ( volume < 0 )
			volume*=-1;
		return volume;
	}